

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O0

bool __thiscall Game::teamMembers(Game *this,size_t player1,size_t player2)

{
  bool local_55;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_40;
  unsigned_long local_28;
  size_t player2_local;
  size_t player1_local;
  Game *this_local;
  
  local_55 = true;
  local_28 = player2;
  player2_local = player1;
  player1_local = (size_t)this;
  if (player1 != player2) {
    getTeamMember(&local_40,this,player1);
    local_55 = contains<unsigned_long>(&local_40,local_28);
  }
  this_local._7_1_ = local_55;
  if (player1 != player2) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_40);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Game::teamMembers(size_t player1, size_t player2) {
    return player1 == player2 || contains(getTeamMember(player1), player2);
}